

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::optimizeAll
          (pfederc *this,unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr,
          size_t *reducedexpressions)

{
  __tuple_element_t<1UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_bool>_> *p_Var1;
  __tuple_element_t<0UL,_tuple<unique_ptr<Expr,_default_delete<Expr>_>,_bool>_> *p_Var2;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> local_40;
  undefined1 local_30 [8];
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tpl;
  size_t *reducedexpressions_local;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *expr_local;
  
  tpl.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)
       (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)reducedexpressions;
  optimize((pfederc *)local_30,expr,reducedexpressions);
  while( true ) {
    p_Var1 = std::get<1ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,bool>
                       ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
                         *)local_30);
    if ((*p_Var1 & 1U) == 0) break;
    p_Var2 = std::get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,bool>
                       ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
                         *)local_30);
    optimize((pfederc *)&local_40,p_Var2,
             (size_t *)
             tpl.
             super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
             .
             super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
             ._M_head_impl._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
             super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
             super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
    std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::operator=
              ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> *)
               local_30,&local_40);
    std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::~tuple
              (&local_40);
  }
  p_Var2 = std::get<0ul,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,bool>
                     ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
                       *)local_30);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)this,p_Var2);
  std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::~tuple
            ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> *)
             local_30);
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> pfederc::optimizeAll(std::unique_ptr<Expr> &&expr,
    size_t &reducedexpressions) noexcept {
  auto tpl = optimize(std::move(expr), reducedexpressions);
  while (std::get<1>(tpl)) {
    tpl = optimize(std::move(std::move(std::get<0>(tpl))), reducedexpressions);
  }

  return std::move(std::get<0>(tpl));
}